

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btCompoundCollisionAlgorithm::processCollision
          (btCompoundCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  int iVar1;
  int iVar2;
  btTransform *other;
  btCollisionAlgorithm **ppbVar3;
  btPersistentManifold **ppbVar4;
  btDbvt *this_00;
  btTransform *pbVar5;
  btCollisionShape *pbVar6;
  btTransform *t;
  btCollisionObjectWrapper *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  long in_RDI;
  btManifoldResult *in_R8;
  btTransform *childTrans;
  btVector3 aabbMax1;
  btVector3 aabbMin1;
  btVector3 aabbMax0;
  btVector3 aabbMin0;
  btTransform newChildWorldTrans;
  btTransform orgTrans;
  btCollisionShape *childShape;
  btManifoldArray manifoldArray_1;
  int i_2;
  int numChildren_1;
  int i_1;
  int numChildren;
  btDbvtVolume bounds;
  btTransform otherInCompoundSpace;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  int m;
  btManifoldArray manifoldArray;
  int i;
  btCompoundLeafCallback callback;
  btDbvt *tree;
  btCompoundShape *compoundShape;
  btCollisionObjectWrapper *otherObjWrap;
  btCollisionObjectWrapper *colObjWrap;
  btCompoundShape *this_01;
  btVector3 *in_stack_fffffffffffffbe8;
  btCompoundCollisionAlgorithm *in_stack_fffffffffffffbf0;
  btCollisionObjectWrapper *in_stack_fffffffffffffbf8;
  btCompoundLeafCallback *in_stack_fffffffffffffc00;
  btVector3 *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  btPersistentManifold *in_stack_fffffffffffffc18;
  btTransform *in_stack_fffffffffffffc30;
  btTransform *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  btCollisionObjectWrapper *in_stack_fffffffffffffc70;
  btCollisionObjectWrapper *in_stack_fffffffffffffc78;
  btManifoldResult *this_02;
  btCompoundCollisionAlgorithm *in_stack_fffffffffffffc80;
  btCollisionObjectWrapper *local_320;
  btCollisionObjectWrapper *local_318;
  int in_stack_fffffffffffffd14;
  btCollisionShape *in_stack_fffffffffffffd18;
  btCompoundLeafCallback *in_stack_fffffffffffffd20;
  btVector3 local_2c0;
  btVector3 local_2b0;
  btVector3 local_2a0;
  btVector3 local_290;
  undefined1 local_280 [128];
  btTransform *local_200;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  undefined1 local_128 [64];
  btVector3 local_e8;
  btVector3 local_d8;
  undefined8 local_c8;
  int local_c0;
  btAlignedObjectArray<btPersistentManifold_*> local_b0;
  int local_8c;
  btDbvt *local_48;
  btCompoundShape *local_40;
  btCollisionObjectWrapper *local_38;
  btCollisionObjectWrapper *local_30;
  btManifoldResult *local_28;
  
  local_318 = in_RSI;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    local_318 = in_RDX;
  }
  local_30 = local_318;
  local_320 = in_RDX;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    local_320 = in_RSI;
  }
  local_38 = local_320;
  local_28 = in_R8;
  local_40 = (btCompoundShape *)btCollisionObjectWrapper::getCollisionShape(local_318);
  iVar1 = btCompoundShape::getUpdateRevision(local_40);
  if (iVar1 != *(int *)(in_RDI + 0x44)) {
    removeChildAlgorithms(in_stack_fffffffffffffbf0);
    preallocateChildAlgorithms
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    iVar1 = btCompoundShape::getUpdateRevision(local_40);
    *(int *)(in_RDI + 0x44) = iVar1;
  }
  iVar1 = btAlignedObjectArray<btCollisionAlgorithm_*>::size
                    ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10));
  if (iVar1 != 0) {
    local_48 = btCompoundShape::getDynamicAabbTree(local_40);
    other = (btTransform *)
            btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                      ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),0);
    this_01 = *(btCompoundShape **)(in_RDI + 0x38);
    btCompoundLeafCallback::btCompoundLeafCallback
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               (btCollisionObjectWrapper *)in_stack_fffffffffffffbf0,
               (btDispatcher *)in_stack_fffffffffffffbe8,(btDispatcherInfo *)this_01,
               (btManifoldResult *)other,
               (btCollisionAlgorithm **)
               CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
               in_stack_fffffffffffffc18);
    btAlignedObjectArray<btPersistentManifold_*>::btAlignedObjectArray
              ((btAlignedObjectArray<btPersistentManifold_*> *)this_01);
    for (local_8c = 0; iVar1 = local_8c,
        iVar2 = btAlignedObjectArray<btCollisionAlgorithm_*>::size
                          ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10)),
        iVar1 < iVar2; local_8c = local_8c + 1) {
      ppbVar3 = btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                          ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),local_8c)
      ;
      if (*ppbVar3 != (btCollisionAlgorithm *)0x0) {
        ppbVar3 = btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                            ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),
                             local_8c);
        (*(*ppbVar3)->_vptr_btCollisionAlgorithm[4])(*ppbVar3,&local_b0);
        for (local_c0 = 0; iVar1 = local_c0,
            iVar2 = btAlignedObjectArray<btPersistentManifold_*>::size(&local_b0), iVar1 < iVar2;
            local_c0 = local_c0 + 1) {
          ppbVar4 = btAlignedObjectArray<btPersistentManifold_*>::operator[](&local_b0,local_c0);
          iVar1 = btPersistentManifold::getNumContacts(*ppbVar4);
          if (iVar1 != 0) {
            this_02 = local_28;
            ppbVar4 = btAlignedObjectArray<btPersistentManifold_*>::operator[](&local_b0,local_c0);
            btManifoldResult::setPersistentManifold(this_02,*ppbVar4);
            btManifoldResult::refreshContactPoints
                      ((btManifoldResult *)
                       CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
            btManifoldResult::setPersistentManifold(local_28,(btPersistentManifold *)0x0);
          }
        }
        local_c8 = 0;
        btAlignedObjectArray<btPersistentManifold_*>::resize
                  ((btAlignedObjectArray<btPersistentManifold_*> *)in_stack_fffffffffffffc00,
                   (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                   (btPersistentManifold **)in_stack_fffffffffffffbf0);
      }
    }
    btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray
              ((btAlignedObjectArray<btPersistentManifold_*> *)0x18f08e);
    if (local_48 == (btDbvt *)0x0) {
      local_1cc = btAlignedObjectArray<btCollisionAlgorithm_*>::size
                            ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10));
      for (local_1d0 = 0; local_1d0 < local_1cc; local_1d0 = local_1d0 + 1) {
        btCompoundShape::getChildShape(this_01,(int)((ulong)other >> 0x20));
        btCompoundLeafCallback::ProcessChildShape
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd14);
      }
    }
    else {
      btVector3::btVector3(&local_d8);
      btVector3::btVector3(&local_e8);
      btTransform::btTransform((btTransform *)this_01);
      this_00 = (btDbvt *)btCollisionObjectWrapper::getWorldTransform(local_30);
      btTransform::inverse
                ((btTransform *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      pbVar5 = btCollisionObjectWrapper::getWorldTransform(local_38);
      btTransform::operator*(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      btTransform::operator=((btTransform *)this_01,other);
      pbVar6 = btCollisionObjectWrapper::getCollisionShape(local_38);
      (*pbVar6->_vptr_btCollisionShape[2])(pbVar6,local_128,&local_d8,&local_e8);
      btDbvtAabbMm::FromMM((btVector3 *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      btDbvt::collideTV(this_00,(btDbvtNode *)pbVar5,(btDbvtVolume *)pbVar6,
                        (ICollide *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    }
    local_1d4 = btAlignedObjectArray<btCollisionAlgorithm_*>::size
                          ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10));
    btAlignedObjectArray<btPersistentManifold_*>::btAlignedObjectArray
              ((btAlignedObjectArray<btPersistentManifold_*> *)this_01);
    local_200 = (btTransform *)0x0;
    btTransform::btTransform((btTransform *)this_01);
    btTransform::btTransform((btTransform *)this_01);
    btVector3::btVector3(&local_290);
    btVector3::btVector3(&local_2a0);
    btVector3::btVector3(&local_2b0);
    btVector3::btVector3(&local_2c0);
    for (local_1d8 = 0; local_1d8 < local_1d4; local_1d8 = local_1d8 + 1) {
      ppbVar3 = btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                          ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),local_1d8
                          );
      if (*ppbVar3 != (btCollisionAlgorithm *)0x0) {
        pbVar5 = (btTransform *)btCompoundShape::getChildShape(this_01,(int)((ulong)other >> 0x20));
        local_200 = pbVar5;
        t = btCollisionObjectWrapper::getWorldTransform(local_30);
        btTransform::operator=((btTransform *)this_01,other);
        btCompoundShape::getChildTransform(this_01,(int)((ulong)other >> 0x20));
        btTransform::operator*(pbVar5,t);
        btTransform::operator=((btTransform *)this_01,other);
        (*(*(_func_int ***)(local_200->m_basis).m_el[0].m_floats)[2])
                  (local_200,local_280,&local_290,&local_2a0);
        pbVar6 = btCollisionObjectWrapper::getCollisionShape(local_38);
        pbVar5 = btCollisionObjectWrapper::getWorldTransform(local_38);
        (*pbVar6->_vptr_btCollisionShape[2])(pbVar6,pbVar5,&local_2b0,&local_2c0);
        in_stack_fffffffffffffc17 =
             TestAabbAgainstAabb2
                       ((btVector3 *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                        in_stack_fffffffffffffc08,(btVector3 *)in_stack_fffffffffffffc00,
                        (btVector3 *)in_stack_fffffffffffffbf8);
        if (!(bool)in_stack_fffffffffffffc17) {
          in_stack_fffffffffffffc08 =
               (btVector3 *)
               btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                         ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),local_1d8)
          ;
          (**(*(btCollisionAlgorithm **)in_stack_fffffffffffffc08->m_floats)->
             _vptr_btCollisionAlgorithm)();
          in_stack_fffffffffffffbf8 = *(btCollisionObjectWrapper **)(in_RDI + 8);
          in_stack_fffffffffffffc00 =
               (btCompoundLeafCallback *)
               btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                         ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),local_1d8)
          ;
          (*(code *)in_stack_fffffffffffffbf8->m_parent[3].m_parent)
                    (in_stack_fffffffffffffbf8,
                     (btCollisionAlgorithm *)
                     (in_stack_fffffffffffffc00->super_ICollide)._vptr_ICollide);
          ppbVar3 = btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                              ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),
                               local_1d8);
          *ppbVar3 = (btCollisionAlgorithm *)0x0;
        }
      }
    }
    btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray
              ((btAlignedObjectArray<btPersistentManifold_*> *)0x18f586);
    btCompoundLeafCallback::~btCompoundLeafCallback((btCompoundLeafCallback *)0x18f593);
  }
  return;
}

Assistant:

void btCompoundCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	const btCollisionObjectWrapper* colObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* otherObjWrap = m_isSwapped? body0Wrap : body1Wrap;

	btAssert (colObjWrap->getCollisionShape()->isCompound());
	const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(colObjWrap->getCollisionShape());

	///btCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if (compoundShape->getUpdateRevision() != m_compoundShapeRevision)
	{
		///clear and update all
		removeChildAlgorithms();
		
		preallocateChildAlgorithms(body0Wrap,body1Wrap);
		m_compoundShapeRevision = compoundShape->getUpdateRevision();
	}

    if (m_childCollisionAlgorithms.size()==0)
        return;
    
	const btDbvt* tree = compoundShape->getDynamicAabbTree();
	//use a dynamic aabb tree to cull potential child-overlaps
	btCompoundLeafCallback  callback(colObjWrap,otherObjWrap,m_dispatcher,dispatchInfo,resultOut,&m_childCollisionAlgorithms[0],m_sharedManifold);

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, btCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the btCollisionAlgorithm
	{
		int i;
		btManifoldArray manifoldArray;
		for (i=0;i<m_childCollisionAlgorithms.size();i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				m_childCollisionAlgorithms[i]->getAllContactManifolds(manifoldArray);
				for (int m=0;m<manifoldArray.size();m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);//??necessary?
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	if (tree)
	{

		btVector3 localAabbMin,localAabbMax;
		btTransform otherInCompoundSpace;
		otherInCompoundSpace = colObjWrap->getWorldTransform().inverse() * otherObjWrap->getWorldTransform();
		otherObjWrap->getCollisionShape()->getAabb(otherInCompoundSpace,localAabbMin,localAabbMax);

		const ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
		//process all children, that overlap with  the given AABB bounds
		tree->collideTV(tree->m_root,bounds,callback);

	} else
	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		for (i=0;i<numChildren;i++)
		{
			callback.ProcessChildShape(compoundShape->getChildShape(i),i);
		}
	}

	{
				//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		btManifoldArray	manifoldArray;
        const btCollisionShape* childShape = 0;
        btTransform	orgTrans;
        
        btTransform	newChildWorldTrans;
        btVector3 aabbMin0,aabbMax0,aabbMin1,aabbMax1;        
        
		for (i=0;i<numChildren;i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				childShape = compoundShape->getChildShape(i);
			//if not longer overlapping, remove the algorithm
				orgTrans = colObjWrap->getWorldTransform();
                
				const btTransform& childTrans = compoundShape->getChildTransform(i);
                newChildWorldTrans = orgTrans*childTrans ;

				//perform an AABB check first
				childShape->getAabb(newChildWorldTrans,aabbMin0,aabbMax0);
				otherObjWrap->getCollisionShape()->getAabb(otherObjWrap->getWorldTransform(),aabbMin1,aabbMax1);

				if (!TestAabbAgainstAabb2(aabbMin0,aabbMax0,aabbMin1,aabbMax1))
				{
					m_childCollisionAlgorithms[i]->~btCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(m_childCollisionAlgorithms[i]);
					m_childCollisionAlgorithms[i] = 0;
				}
			}
		}
	}
}